

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString(String *__return_storage_ptr__,longdouble in)

{
  longdouble in_local;
  
  anon_unknown_14::fpToString<long_double>(__return_storage_ptr__,in,0xf);
  return __return_storage_ptr__;
}

Assistant:

String toString(double long in) { return fpToString(in, 15); }